

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbmphandler.cpp
# Opt level: O0

ssize_t __thiscall QBmpHandler::write(QBmpHandler *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  Format FVar2;
  int iVar3;
  int iVar4;
  QIODevice *pQVar5;
  long lVar6;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QIODevice *d;
  qsizetype bpl;
  qsizetype bpl_bmp;
  int nbits;
  QImage image;
  BMP_FILEHDR bf;
  QDataStream s;
  QDataStream dibStream;
  undefined4 in_stack_fffffffffffffe68;
  ImageConversionFlag in_stack_fffffffffffffe6c;
  QImage *in_stack_fffffffffffffe70;
  QImage *in_stack_fffffffffffffe78;
  QImage *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  QFlagsStorage<Qt::ImageConversionFlag> flags;
  QImage *local_118;
  bool local_f5;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  QImage *in_stack_ffffffffffffff30;
  QDataStream *in_stack_ffffffffffffff38;
  undefined1 local_78 [16];
  QImageData *local_68;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  flags.i = (Int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage(in_stack_fffffffffffffe70);
  FVar2 = QImage::format((QImage *)CONCAT44(in_register_00000034,__fd));
  if (FVar2 != Format_Mono) {
    if (FVar2 == Format_MonoLSB) {
      QFlags<Qt::ImageConversionFlag>::QFlags
                ((QFlags<Qt::ImageConversionFlag> *)in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe6c);
      QImage::convertToFormat
                (in_stack_fffffffffffffe78,(Format)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                 (ImageConversionFlags)flags.i);
      QImage::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      QImage::~QImage(in_stack_fffffffffffffe70);
      goto LAB_0028556a;
    }
    if (2 < FVar2 - Format_Indexed8) {
      if (FVar2 - Format_Alpha8 < 2) {
        QFlags<Qt::ImageConversionFlag>::QFlags
                  ((QFlags<Qt::ImageConversionFlag> *)in_stack_fffffffffffffe70,
                   in_stack_fffffffffffffe6c);
        QImage::convertToFormat
                  (in_stack_fffffffffffffe78,(Format)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                   (ImageConversionFlags)flags.i);
        QImage::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
        QImage::~QImage(in_stack_fffffffffffffe70);
      }
      else {
        bVar1 = QImage::hasAlphaChannel(in_stack_fffffffffffffe78);
        if (bVar1) {
          QFlags<Qt::ImageConversionFlag>::QFlags
                    ((QFlags<Qt::ImageConversionFlag> *)in_stack_fffffffffffffe70,
                     in_stack_fffffffffffffe6c);
          QImage::convertToFormat
                    (in_stack_fffffffffffffe78,(Format)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                     (ImageConversionFlags)flags.i);
          QImage::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
          QImage::~QImage(in_stack_fffffffffffffe70);
        }
        else {
          QFlags<Qt::ImageConversionFlag>::QFlags
                    ((QFlags<Qt::ImageConversionFlag> *)in_stack_fffffffffffffe70,
                     in_stack_fffffffffffffe6c);
          QImage::convertToFormat
                    (in_stack_fffffffffffffe78,(Format)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                     (ImageConversionFlags)flags.i);
          QImage::operator=(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
          QImage::~QImage(in_stack_fffffffffffffe70);
        }
      }
      goto LAB_0028556a;
    }
  }
  QImage::operator=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
LAB_0028556a:
  iVar3 = QImage::width((QImage *)local_78);
  iVar4 = QImage::depth((QImage *)local_78);
  local_118 = (QImage *)(long)((iVar3 * iVar4 + 0x1f >> 5) << 2);
  iVar3 = QImage::depth((QImage *)local_78);
  if ((iVar3 == 8) && (iVar3 = QImage::colorCount(in_stack_fffffffffffffe70), iVar3 < 0x11)) {
    local_118 = (QImage *)
                (((long)((long)&(local_118->super_QPaintDevice)._vptr_QPaintDevice + 1) / 2 + 3) / 4
                << 2);
  }
  else {
    iVar3 = QImage::depth((QImage *)local_78);
    if (iVar3 == 0x20) {
      iVar3 = QImage::width((QImage *)local_78);
      local_118 = (QImage *)(long)((iVar3 * 0x18 + 0x1f) / 0x20 << 2);
    }
    else {
      QImage::depth((QImage *)local_78);
    }
  }
  if ((QImage *)(long)(int)local_118 == local_118) {
    if (this->m_format == DibFormat) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = QImageIOHandler::device((QImageIOHandler *)in_stack_fffffffffffffe70);
      QDataStream::QDataStream((QDataStream *)&local_28,pQVar5);
      QDataStream::setByteOrder((ByteOrder)&local_28);
      local_f5 = qt_write_dib(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                              in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,
                              in_stack_ffffffffffffff24);
      QDataStream::~QDataStream((QDataStream *)&local_28);
    }
    else {
      pQVar5 = QImageIOHandler::device((QImageIOHandler *)in_stack_fffffffffffffe70);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      QDataStream::QDataStream((QDataStream *)&local_48,pQVar5);
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      QDataStream::setByteOrder((ByteOrder)&local_48);
      local_58 = (undefined1 *)CONCAT62(local_58._2_6_,0x4d42);
      local_50 = (undefined1 *)((ulong)local_50 & 0xffffffff00000000);
      iVar3 = QImage::colorCount(in_stack_fffffffffffffe70);
      iVar4 = iVar3 * 4 + 0x36;
      local_50 = (undefined1 *)CONCAT44(iVar4,(undefined4)local_50);
      in_stack_fffffffffffffe70 = local_118;
      iVar3 = QImage::height((QImage *)local_78);
      iVar4 = iVar4 + (int)in_stack_fffffffffffffe70 * iVar3;
      local_58 = (undefined1 *)CONCAT44(iVar4,(undefined4)local_58);
      lVar6 = (long)local_50._4_4_;
      iVar3 = QImage::height((QImage *)local_78);
      if ((long)iVar4 == lVar6 + (long)local_118 * (long)iVar3) {
        ::operator<<((QDataStream *)in_stack_fffffffffffffe70,
                     (BMP_FILEHDR *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        local_f5 = qt_write_dib(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                                in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,
                                in_stack_ffffffffffffff24);
      }
      else {
        local_f5 = false;
      }
      QDataStream::~QDataStream((QDataStream *)&local_48);
    }
  }
  else {
    local_f5 = false;
  }
  QImage::~QImage(in_stack_fffffffffffffe70);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_f5);
}

Assistant:

bool QBmpHandler::write(const QImage &img)
{
    QImage image;
    switch (img.format()) {
    case QImage::Format_Mono:
    case QImage::Format_Indexed8:
    case QImage::Format_RGB32:
    case QImage::Format_ARGB32:
        image = img;
        break;
    case QImage::Format_MonoLSB:
        image = img.convertToFormat(QImage::Format_Mono);
        break;
    case QImage::Format_Alpha8:
    case QImage::Format_Grayscale8:
        image = img.convertToFormat(QImage::Format_Indexed8);
        break;
    default:
        if (img.hasAlphaChannel())
            image = img.convertToFormat(QImage::Format_ARGB32);
        else
            image = img.convertToFormat(QImage::Format_RGB32);
        break;
    }

    int nbits;
    qsizetype bpl_bmp;
    // Calculate a minimum bytes-per-line instead of using whatever value this QImage is using internally.
    qsizetype bpl = ((image.width() * image.depth() + 31) >> 5) << 2;

    if (image.depth() == 8 && image.colorCount() <= 16) {
        bpl_bmp = (((bpl+1)/2+3)/4)*4;
        nbits = 4;
   } else if (image.depth() == 32) {
        bpl_bmp = ((image.width()*24+31)/32)*4;
        nbits = 24;
    } else {
        bpl_bmp = bpl;
        nbits = image.depth();
    }
    if (qsizetype(int(bpl_bmp)) != bpl_bmp)
        return false;

    if (m_format == DibFormat) {
        QDataStream dibStream(device());
        dibStream.setByteOrder(QDataStream::LittleEndian); // Intel byte order
        return qt_write_dib(dibStream, img, bpl, bpl_bmp, nbits);
    }

    QIODevice *d = device();
    QDataStream s(d);
    BMP_FILEHDR bf;

    // Intel byte order
    s.setByteOrder(QDataStream::LittleEndian);

    // build file header
    memcpy(bf.bfType, "BM", 2);

    // write file header
    bf.bfReserved1 = 0;
    bf.bfReserved2 = 0;
    bf.bfOffBits = BMP_FILEHDR_SIZE + BMP_WIN + image.colorCount() * 4;
    bf.bfSize = bf.bfOffBits + bpl_bmp*image.height();
    if (qsizetype(bf.bfSize) != bf.bfOffBits + bpl_bmp*image.height())
        return false;
    s << bf;

    // write image
    return qt_write_dib(s, image, bpl, bpl_bmp, nbits);
}